

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Float __thiscall pbrt::FloatDotsTexture::Evaluate(FloatDotsTexture *this,TextureEvalContext ctx)

{
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  undefined1 auVar1 [64];
  bool bVar2;
  long lVar3;
  long in_RDI;
  undefined1 auVar4 [64];
  Float FVar5;
  undefined1 extraout_var [56];
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  undefined1 auVar7 [12];
  undefined1 auVar6 [40];
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  Point2f *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  TextureMapping2DHandle *this_00;
  undefined1 *puVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 in_stack_ffffffffffffff18 [56];
  undefined8 uStack_b0;
  undefined1 local_a8 [64];
  undefined1 local_68 [64];
  undefined8 local_20;
  undefined1 local_18 [24];
  
  this_00 = (TextureMapping2DHandle *)&stack0x00000008;
  Vector2<float>::Vector2((Vector2<float> *)0x6ec60b);
  puVar8 = local_18;
  Vector2<float>::Vector2((Vector2<float> *)0x6ec61d);
  auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])this_00);
  local_68 = vmovdqu64_avx512f(auVar4);
  auVar4 = vmovdqu64_avx512f(local_68);
  vmovdqu64_avx512f(auVar4);
  auVar9 = in_stack_ffffffffffffff18._4_12_;
  auVar10 = in_stack_ffffffffffffff18._16_12_;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)in_stack_ffffffffffffff18._0_4_;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar9._0_4_;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar9._4_4_;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar9._8_4_;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar10._0_4_;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar10._4_4_;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar10._8_4_;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_ffffffffffffff18._28_8_;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_ffffffffffffff18._28_8_ >> 0x20);
  ctx_02.dudx = (Float)in_stack_ffffffffffffff18._36_4_;
  ctx_02.dudy = (Float)in_stack_ffffffffffffff18._40_4_;
  ctx_02.dvdx = (Float)in_stack_ffffffffffffff18._44_4_;
  ctx_02.dvdy = (Float)in_stack_ffffffffffffff18._48_4_;
  ctx_02.faceIndex = in_stack_ffffffffffffff18._52_4_;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar8;
  auVar4._0_8_ = TextureMapping2DHandle::Map
                           (this_00,ctx_02,
                            (Vector2f *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (Vector2f *)in_stack_fffffffffffffee8);
  auVar4._8_56_ = extraout_var;
  local_20 = vmovlpd_avx(auVar4._0_16_);
  bVar2 = DotsBase::Inside(in_stack_fffffffffffffee8);
  if (bVar2) {
    lVar3 = in_RDI + 0x10;
    memcpy(local_a8,this_00,0x40);
    auVar4 = vmovdqu64_avx512f(local_a8);
    auVar4 = vmovdqu64_avx512f(auVar4);
    auVar6 = auVar4._24_40_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffed8;
    ctx_00.dudx = (Float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    auVar9 = auVar6._0_12_;
    auVar10 = auVar6._12_12_;
    auVar7 = auVar6._24_12_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar9._0_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar9._4_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar9._8_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar10._0_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar10._4_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar10._8_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar7._0_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar7._4_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar7._8_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar6._36_4_;
    ctx_00.dudy = (Float)(int)in_stack_fffffffffffffee0;
    ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    ctx_00.dvdy = (Float)(int)lVar3;
    ctx_00.faceIndex = (int)((ulong)lVar3 >> 0x20);
    FVar5 = FloatTextureHandle::Evaluate(auVar4._8_8_,ctx_00);
  }
  else {
    lVar3 = in_RDI + 8;
    memcpy(&stack0xffffffffffffff18,this_00,0x40);
    auVar1._56_8_ = uStack_b0;
    auVar1._0_56_ = in_stack_ffffffffffffff18;
    auVar4 = vmovdqu64_avx512f(auVar1);
    auVar4 = vmovdqu64_avx512f(auVar4);
    auVar6 = auVar4._24_40_;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffed8;
    ctx_01.dudx = (Float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    auVar9 = auVar6._0_12_;
    auVar10 = auVar6._12_12_;
    auVar7 = auVar6._24_12_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar9._0_4_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar9._4_4_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar9._8_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar10._0_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar10._4_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar10._8_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar7._0_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar7._4_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar7._8_4_;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar6._36_4_;
    ctx_01.dudy = (Float)(int)lVar3;
    ctx_01.dvdx = (Float)(int)((ulong)lVar3 >> 0x20);
    ctx_01._56_8_ = in_stack_fffffffffffffee8;
    FVar5 = FloatTextureHandle::Evaluate(auVar4._8_8_,ctx_01);
  }
  return FVar5;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx) : outsideDot.Evaluate(ctx);
    }